

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int openDatabase(char *zFilename,sqlite3 **ppDb,uint flags,char *zVfs)

{
  bool bVar1;
  char *p;
  int iVar2;
  sqlite3 *db;
  Schema *pSVar3;
  sqlite3_mutex *psVar4;
  Db *pDVar5;
  char *zFormat;
  uint uVar6;
  _func_int_sqlite3_ptr **pp_Var7;
  int err_code;
  code *pcVar8;
  ulong uVar9;
  bool bVar10;
  uint local_6c;
  char *zOpen;
  void *local_60;
  char *local_58;
  sqlite3_mutex **local_50;
  char *zErrMsg;
  char *local_40;
  sqlite3 **local_38;
  
  zOpen = (char *)0x0;
  zErrMsg = (char *)0x0;
  *ppDb = (sqlite3 *)0x0;
  iVar2 = sqlite3_initialize();
  if (iVar2 != 0) {
    return iVar2;
  }
  bVar10 = true;
  if ((-1 < (short)flags) && (sqlite3Config.bCoreMutex != '\0')) {
    if ((flags >> 0x10 & 1) == 0) {
      bVar10 = sqlite3Config.bFullMutex == '\0';
    }
    else {
      bVar10 = false;
    }
  }
  if ((flags >> 0x12 & 1) == 0) {
    if (sqlite3Config.sharedCacheEnabled != 0) {
      flags = flags | 0x20000;
    }
  }
  else {
    flags = flags & 0xfffdffff;
  }
  local_6c = flags & 0xfff600e7;
  local_40 = zFilename;
  local_38 = ppDb;
  db = (sqlite3 *)sqlite3MallocZero(0x300);
  if (db != (sqlite3 *)0x0) {
    if (bVar10) {
      local_50 = &db->mutex;
      psVar4 = db->mutex;
      local_58 = zVfs;
      if (psVar4 != (sqlite3_mutex *)0x0) {
LAB_001215ee:
        local_50 = &db->mutex;
        local_58 = zVfs;
        (*sqlite3Config.mutex.xMutexEnter)(psVar4);
      }
      db->errMask = -(uint)((flags >> 0x19 & 1) != 0) | 0xff;
      db->nDb = 2;
      db->eOpenState = 'm';
      db->aDb = db->aDbStatic;
      (db->lookaside).bDisable = 1;
      (db->lookaside).sz = 0;
      db->aLimit[8] = 50000;
      db->aLimit[9] = 0x7ffe;
      db->aLimit[10] = 1000;
      db->aLimit[0xb] = 8;
      db->aLimit[0] = 1000000000;
      db->aLimit[1] = 1000000000;
      db->aLimit[2] = 2000;
      db->aLimit[3] = 1000;
      db->aLimit[4] = 500;
      db->aLimit[5] = 250000000;
      db->aLimit[6] = 0x7f;
      db->aLimit[7] = 10;
      db->aLimit[0xb] = 0;
      db->autoCommit = '\x01';
      db->nextAutovac = -1;
      db->szMmap = sqlite3Config.szMmap;
      db->nextPagesize = 0;
      (db->init).azInit = sqlite3StdType;
      *(uint *)&db->flags = (uint)db->flags | 0xe00480e0;
      (db->aCollSeq).htsize = 0;
      (db->aCollSeq).count = 0;
      (db->aCollSeq).first = (HashElem *)0x0;
      (db->aCollSeq).ht = (_ht *)0x0;
      (db->aModule).htsize = 0;
      (db->aModule).count = 0;
      (db->aModule).first = (HashElem *)0x0;
      (db->aModule).ht = (_ht *)0x0;
      createCollation(db,"BINARY",'\x01',(void *)0x0,binCollFunc,(_func_void_void_ptr *)0x0);
      createCollation(db,"BINARY",'\x03',(void *)0x0,binCollFunc,(_func_void_void_ptr *)0x0);
      createCollation(db,"BINARY",'\x02',(void *)0x0,binCollFunc,(_func_void_void_ptr *)0x0);
      createCollation(db,"NOCASE",'\x01',(void *)0x0,nocaseCollatingFunc,(_func_void_void_ptr *)0x0)
      ;
      createCollation(db,"RTRIM",'\x01',(void *)0x0,rtrimCollFunc,(_func_void_void_ptr *)0x0);
      if (db->mallocFailed == '\0') {
        db->openFlags = flags & 0xfff600e7;
        if ((0x46U >> (flags & 7) & 1) == 0) {
          iVar2 = sqlite3MisuseError(0x2a7da);
        }
        else {
          iVar2 = sqlite3ParseUri(local_58,local_40,&local_6c,(sqlite3_vfs **)db,&zOpen,&zErrMsg);
        }
        if (iVar2 == 0) {
          iVar2 = sqlite3BtreeOpen(db->pVfs,zOpen,db,&db->aDb->pBt,0,local_6c | 0x100);
          if (iVar2 == 0) {
            sqlite3BtreeEnter(db->aDb->pBt);
            pSVar3 = sqlite3SchemaGet(db,db->aDb->pBt);
            pDVar5 = db->aDb;
            pDVar5->pSchema = pSVar3;
            if (db->mallocFailed == '\0') {
              sqlite3SetTextEncoding(db,pSVar3->enc);
              pDVar5 = db->aDb;
            }
            sqlite3BtreeLeave(pDVar5->pBt);
            pSVar3 = sqlite3SchemaGet(db,(Btree *)0x0);
            pDVar5 = db->aDb;
            pDVar5[1].pSchema = pSVar3;
            pDVar5->zDbSName = "main";
            pDVar5->safety_level = '\x03';
            pDVar5[1].zDbSName = "temp";
            pDVar5[1].safety_level = '\x01';
            db->eOpenState = 'v';
            if (db->mallocFailed == '\0') {
              sqlite3Error(db,0);
              iVar2 = sqlite3_overload_function(db,"MATCH",2);
              if (iVar2 == 7) {
                sqlite3OomFault(db);
              }
              iVar2 = sqlite3_errcode(db);
              pp_Var7 = sqlite3BuiltinExtensions;
              for (uVar9 = 0; (iVar2 == 0 && (uVar9 < 2)); uVar9 = uVar9 + 1) {
                iVar2 = (**pp_Var7)(db);
                pp_Var7 = pp_Var7 + 1;
              }
              if (iVar2 == 0) {
                if (sqlite3Autoext_0 != 0) {
                  uVar6 = 0;
                  bVar10 = true;
                  while (bVar10) {
                    bVar1 = true;
                    if ((sqlite3Config.bCoreMutex == '\0') ||
                       (psVar4 = (*sqlite3Config.mutex.xMutexAlloc)(2),
                       psVar4 == (sqlite3_mutex *)0x0)) {
                      psVar4 = (sqlite3_mutex *)0x0;
                    }
                    else {
                      (*sqlite3Config.mutex.xMutexEnter)(psVar4);
                      bVar1 = false;
                    }
                    if (sqlite3Autoext_0 <= uVar6) {
                      pcVar8 = (code *)0x0;
                    }
                    else {
                      pcVar8 = *(code **)(sqlite3Autoext_1 + (ulong)uVar6 * 8);
                    }
                    bVar10 = sqlite3Autoext_0 > uVar6;
                    if (!bVar1) {
                      (*sqlite3Config.mutex.xMutexLeave)(psVar4);
                    }
                    local_60 = (void *)0x0;
                    if ((pcVar8 != (code *)0x0) &&
                       (iVar2 = (*pcVar8)(db,&local_60,&sqlite3Apis), iVar2 != 0)) {
                      bVar10 = false;
                      sqlite3ErrorWithMsg(db,iVar2,"automatic extension loading failed: %s");
                    }
                    sqlite3_free(local_60);
                    uVar6 = uVar6 + 1;
                  }
                }
                iVar2 = sqlite3_errcode(db);
                if (iVar2 != 0) goto LAB_00121a16;
              }
              else {
                sqlite3Error(db,iVar2);
              }
              setupLookaside(db,(void *)0x0,sqlite3Config.szLookaside,sqlite3Config.nLookaside);
              sqlite3_wal_autocheckpoint(db,1000);
            }
          }
          else {
            err_code = 7;
            if (iVar2 != 0xc0a) {
              err_code = iVar2;
            }
            sqlite3Error(db,err_code);
          }
        }
        else {
          if (iVar2 == 7) {
            sqlite3OomFault(db);
          }
          p = zErrMsg;
          zFormat = "%s";
          if (zErrMsg == (char *)0x0) {
            zFormat = (char *)0x0;
          }
          sqlite3ErrorWithMsg(db,iVar2,zFormat,zErrMsg);
          sqlite3_free(p);
        }
      }
LAB_00121a16:
      if (*local_50 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(*local_50);
      }
      goto LAB_00121a29;
    }
    if (sqlite3Config.bCoreMutex == '\0') {
      db->mutex = (sqlite3_mutex *)0x0;
    }
    else {
      psVar4 = (*sqlite3Config.mutex.xMutexAlloc)(1);
      db->mutex = psVar4;
      if (psVar4 != (sqlite3_mutex *)0x0) goto LAB_001215ee;
    }
    sqlite3_free(db);
  }
  db = (sqlite3 *)0x0;
LAB_00121a29:
  iVar2 = sqlite3_errcode(db);
  if ((char)iVar2 == '\a') {
    sqlite3_close(db);
    db = (sqlite3 *)0x0;
  }
  else if (iVar2 != 0) {
    db->eOpenState = 0xba;
  }
  *local_38 = db;
  sqlite3_free_filename(zOpen);
  return iVar2;
}

Assistant:

static int openDatabase(
  const char *zFilename, /* Database filename UTF-8 encoded */
  sqlite3 **ppDb,        /* OUT: Returned database handle */
  unsigned int flags,    /* Operational flags */
  const char *zVfs       /* Name of the VFS to use */
){
  sqlite3 *db;                    /* Store allocated handle here */
  int rc;                         /* Return code */
  int isThreadsafe;               /* True for threadsafe connections */
  char *zOpen = 0;                /* Filename argument to pass to BtreeOpen() */
  char *zErrMsg = 0;              /* Error message from sqlite3ParseUri() */
  int i;                          /* Loop counter */

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppDb==0 ) return SQLITE_MISUSE_BKPT;
#endif
  *ppDb = 0;
#ifndef SQLITE_OMIT_AUTOINIT
  rc = sqlite3_initialize();
  if( rc ) return rc;
#endif

  if( sqlite3GlobalConfig.bCoreMutex==0 ){
    isThreadsafe = 0;
  }else if( flags & SQLITE_OPEN_NOMUTEX ){
    isThreadsafe = 0;
  }else if( flags & SQLITE_OPEN_FULLMUTEX ){
    isThreadsafe = 1;
  }else{
    isThreadsafe = sqlite3GlobalConfig.bFullMutex;
  }

  if( flags & SQLITE_OPEN_PRIVATECACHE ){
    flags &= ~SQLITE_OPEN_SHAREDCACHE;
  }else if( sqlite3GlobalConfig.sharedCacheEnabled ){
    flags |= SQLITE_OPEN_SHAREDCACHE;
  }

  /* Remove harmful bits from the flags parameter
  **
  ** The SQLITE_OPEN_NOMUTEX and SQLITE_OPEN_FULLMUTEX flags were
  ** dealt with in the previous code block.  Besides these, the only
  ** valid input flags for sqlite3_open_v2() are SQLITE_OPEN_READONLY,
  ** SQLITE_OPEN_READWRITE, SQLITE_OPEN_CREATE, SQLITE_OPEN_SHAREDCACHE,
  ** SQLITE_OPEN_PRIVATECACHE, SQLITE_OPEN_EXRESCODE, and some reserved
  ** bits.  Silently mask off all other flags.
  */
  flags &=  ~( SQLITE_OPEN_DELETEONCLOSE |
               SQLITE_OPEN_EXCLUSIVE |
               SQLITE_OPEN_MAIN_DB |
               SQLITE_OPEN_TEMP_DB |
               SQLITE_OPEN_TRANSIENT_DB |
               SQLITE_OPEN_MAIN_JOURNAL |
               SQLITE_OPEN_TEMP_JOURNAL |
               SQLITE_OPEN_SUBJOURNAL |
               SQLITE_OPEN_SUPER_JOURNAL |
               SQLITE_OPEN_NOMUTEX |
               SQLITE_OPEN_FULLMUTEX |
               SQLITE_OPEN_WAL
             );

  /* Allocate the sqlite data structure */
  db = sqlite3MallocZero( sizeof(sqlite3) );
  if( db==0 ) goto opendb_out;
  if( isThreadsafe
#ifdef SQLITE_ENABLE_MULTITHREADED_CHECKS
   || sqlite3GlobalConfig.bCoreMutex
#endif
  ){
    db->mutex = sqlite3MutexAlloc(SQLITE_MUTEX_RECURSIVE);
    if( db->mutex==0 ){
      sqlite3_free(db);
      db = 0;
      goto opendb_out;
    }
    if( isThreadsafe==0 ){
      sqlite3MutexWarnOnContention(db->mutex);
    }
  }
  sqlite3_mutex_enter(db->mutex);
  db->errMask = (flags & SQLITE_OPEN_EXRESCODE)!=0 ? 0xffffffff : 0xff;
  db->nDb = 2;
  db->eOpenState = SQLITE_STATE_BUSY;
  db->aDb = db->aDbStatic;
  db->lookaside.bDisable = 1;
  db->lookaside.sz = 0;

  assert( sizeof(db->aLimit)==sizeof(aHardLimit) );
  memcpy(db->aLimit, aHardLimit, sizeof(db->aLimit));
  db->aLimit[SQLITE_LIMIT_WORKER_THREADS] = SQLITE_DEFAULT_WORKER_THREADS;
  db->autoCommit = 1;
  db->nextAutovac = -1;
  db->szMmap = sqlite3GlobalConfig.szMmap;
  db->nextPagesize = 0;
  db->init.azInit = sqlite3StdType; /* Any array of string ptrs will do */
#ifdef SQLITE_ENABLE_SORTER_MMAP
  /* Beginning with version 3.37.0, using the VFS xFetch() API to memory-map
  ** the temporary files used to do external sorts (see code in vdbesort.c)
  ** is disabled. It can still be used either by defining
  ** SQLITE_ENABLE_SORTER_MMAP at compile time or by using the
  ** SQLITE_TESTCTRL_SORTER_MMAP test-control at runtime. */
  db->nMaxSorterMmap = 0x7FFFFFFF;
#endif
  db->flags |= SQLITE_ShortColNames
                 | SQLITE_EnableTrigger
                 | SQLITE_EnableView
                 | SQLITE_CacheSpill
#if !defined(SQLITE_TRUSTED_SCHEMA) || SQLITE_TRUSTED_SCHEMA+0!=0
                 | SQLITE_TrustedSchema
#endif
/* The SQLITE_DQS compile-time option determines the default settings
** for SQLITE_DBCONFIG_DQS_DDL and SQLITE_DBCONFIG_DQS_DML.
**
**    SQLITE_DQS     SQLITE_DBCONFIG_DQS_DDL    SQLITE_DBCONFIG_DQS_DML
**    ----------     -----------------------    -----------------------
**     undefined               on                          on
**         3                   on                          on
**         2                   on                         off
**         1                  off                          on
**         0                  off                         off
**
** Legacy behavior is 3 (double-quoted string literals are allowed anywhere)
** and so that is the default.  But developers are encouranged to use
** -DSQLITE_DQS=0 (best) or -DSQLITE_DQS=1 (second choice) if possible.
*/
#if !defined(SQLITE_DQS)
# define SQLITE_DQS 3
#endif
#if (SQLITE_DQS&1)==1
                 | SQLITE_DqsDML
#endif
#if (SQLITE_DQS&2)==2
                 | SQLITE_DqsDDL
#endif

#if !defined(SQLITE_DEFAULT_AUTOMATIC_INDEX) || SQLITE_DEFAULT_AUTOMATIC_INDEX
                 | SQLITE_AutoIndex
#endif
#if SQLITE_DEFAULT_CKPTFULLFSYNC
                 | SQLITE_CkptFullFSync
#endif
#if SQLITE_DEFAULT_FILE_FORMAT<4
                 | SQLITE_LegacyFileFmt
#endif
#ifdef SQLITE_ENABLE_LOAD_EXTENSION
                 | SQLITE_LoadExtension
#endif
#if SQLITE_DEFAULT_RECURSIVE_TRIGGERS
                 | SQLITE_RecTriggers
#endif
#if defined(SQLITE_DEFAULT_FOREIGN_KEYS) && SQLITE_DEFAULT_FOREIGN_KEYS
                 | SQLITE_ForeignKeys
#endif
#if defined(SQLITE_REVERSE_UNORDERED_SELECTS)
                 | SQLITE_ReverseOrder
#endif
#if defined(SQLITE_ENABLE_OVERSIZE_CELL_CHECK)
                 | SQLITE_CellSizeCk
#endif
#if defined(SQLITE_ENABLE_FTS3_TOKENIZER)
                 | SQLITE_Fts3Tokenizer
#endif
#if defined(SQLITE_ENABLE_QPSG)
                 | SQLITE_EnableQPSG
#endif
#if defined(SQLITE_DEFAULT_DEFENSIVE)
                 | SQLITE_Defensive
#endif
#if defined(SQLITE_DEFAULT_LEGACY_ALTER_TABLE)
                 | SQLITE_LegacyAlter
#endif
      ;
  sqlite3HashInit(&db->aCollSeq);
#ifndef SQLITE_OMIT_VIRTUALTABLE
  sqlite3HashInit(&db->aModule);
#endif

  /* Add the default collation sequence BINARY. BINARY works for both UTF-8
  ** and UTF-16, so add a version for each to avoid any unnecessary
  ** conversions. The only error that can occur here is a malloc() failure.
  **
  ** EVIDENCE-OF: R-52786-44878 SQLite defines three built-in collating
  ** functions:
  */
  createCollation(db, sqlite3StrBINARY, SQLITE_UTF8, 0, binCollFunc, 0);
  createCollation(db, sqlite3StrBINARY, SQLITE_UTF16BE, 0, binCollFunc, 0);
  createCollation(db, sqlite3StrBINARY, SQLITE_UTF16LE, 0, binCollFunc, 0);
  createCollation(db, "NOCASE", SQLITE_UTF8, 0, nocaseCollatingFunc, 0);
  createCollation(db, "RTRIM", SQLITE_UTF8, 0, rtrimCollFunc, 0);
  if( db->mallocFailed ){
    goto opendb_out;
  }

  /* Parse the filename/URI argument
  **
  ** Only allow sensible combinations of bits in the flags argument.
  ** Throw an error if any non-sense combination is used.  If we
  ** do not block illegal combinations here, it could trigger
  ** assert() statements in deeper layers.  Sensible combinations
  ** are:
  **
  **  1:  SQLITE_OPEN_READONLY
  **  2:  SQLITE_OPEN_READWRITE
  **  6:  SQLITE_OPEN_READWRITE | SQLITE_OPEN_CREATE
  */
  db->openFlags = flags;
  assert( SQLITE_OPEN_READONLY  == 0x01 );
  assert( SQLITE_OPEN_READWRITE == 0x02 );
  assert( SQLITE_OPEN_CREATE    == 0x04 );
  testcase( (1<<(flags&7))==0x02 ); /* READONLY */
  testcase( (1<<(flags&7))==0x04 ); /* READWRITE */
  testcase( (1<<(flags&7))==0x40 ); /* READWRITE | CREATE */
  if( ((1<<(flags&7)) & 0x46)==0 ){
    rc = SQLITE_MISUSE_BKPT;  /* IMP: R-18321-05872 */
  }else{
    rc = sqlite3ParseUri(zVfs, zFilename, &flags, &db->pVfs, &zOpen, &zErrMsg);
  }
  if( rc!=SQLITE_OK ){
    if( rc==SQLITE_NOMEM ) sqlite3OomFault(db);
    sqlite3ErrorWithMsg(db, rc, zErrMsg ? "%s" : 0, zErrMsg);
    sqlite3_free(zErrMsg);
    goto opendb_out;
  }

  /* Open the backend database driver */
  rc = sqlite3BtreeOpen(db->pVfs, zOpen, db, &db->aDb[0].pBt, 0,
                        flags | SQLITE_OPEN_MAIN_DB);
  if( rc!=SQLITE_OK ){
    if( rc==SQLITE_IOERR_NOMEM ){
      rc = SQLITE_NOMEM_BKPT;
    }
    sqlite3Error(db, rc);
    goto opendb_out;
  }
  sqlite3BtreeEnter(db->aDb[0].pBt);
  db->aDb[0].pSchema = sqlite3SchemaGet(db, db->aDb[0].pBt);
  if( !db->mallocFailed ){
    sqlite3SetTextEncoding(db, SCHEMA_ENC(db));
  }
  sqlite3BtreeLeave(db->aDb[0].pBt);
  db->aDb[1].pSchema = sqlite3SchemaGet(db, 0);

  /* The default safety_level for the main database is FULL; for the temp
  ** database it is OFF. This matches the pager layer defaults.
  */
  db->aDb[0].zDbSName = "main";
  db->aDb[0].safety_level = SQLITE_DEFAULT_SYNCHRONOUS+1;
  db->aDb[1].zDbSName = "temp";
  db->aDb[1].safety_level = PAGER_SYNCHRONOUS_OFF;

  db->eOpenState = SQLITE_STATE_OPEN;
  if( db->mallocFailed ){
    goto opendb_out;
  }

  /* Register all built-in functions, but do not attempt to read the
  ** database schema yet. This is delayed until the first time the database
  ** is accessed.
  */
  sqlite3Error(db, SQLITE_OK);
  sqlite3RegisterPerConnectionBuiltinFunctions(db);
  rc = sqlite3_errcode(db);


  /* Load compiled-in extensions */
  for(i=0; rc==SQLITE_OK && i<ArraySize(sqlite3BuiltinExtensions); i++){
    rc = sqlite3BuiltinExtensions[i](db);
  }

  /* Load automatic extensions - extensions that have been registered
  ** using the sqlite3_automatic_extension() API.
  */
  if( rc==SQLITE_OK ){
    sqlite3AutoLoadExtensions(db);
    rc = sqlite3_errcode(db);
    if( rc!=SQLITE_OK ){
      goto opendb_out;
    }
  }

#ifdef SQLITE_ENABLE_INTERNAL_FUNCTIONS
  /* Testing use only!!! The -DSQLITE_ENABLE_INTERNAL_FUNCTIONS=1 compile-time
  ** option gives access to internal functions by default.
  ** Testing use only!!! */
  db->mDbFlags |= DBFLAG_InternalFunc;
#endif

  /* -DSQLITE_DEFAULT_LOCKING_MODE=1 makes EXCLUSIVE the default locking
  ** mode.  -DSQLITE_DEFAULT_LOCKING_MODE=0 make NORMAL the default locking
  ** mode.  Doing nothing at all also makes NORMAL the default.
  */
#ifdef SQLITE_DEFAULT_LOCKING_MODE
  db->dfltLockMode = SQLITE_DEFAULT_LOCKING_MODE;
  sqlite3PagerLockingMode(sqlite3BtreePager(db->aDb[0].pBt),
                          SQLITE_DEFAULT_LOCKING_MODE);
#endif

  if( rc ) sqlite3Error(db, rc);

  /* Enable the lookaside-malloc subsystem */
  setupLookaside(db, 0, sqlite3GlobalConfig.szLookaside,
                        sqlite3GlobalConfig.nLookaside);

  sqlite3_wal_autocheckpoint(db, SQLITE_DEFAULT_WAL_AUTOCHECKPOINT);

opendb_out:
  if( db ){
    assert( db->mutex!=0 || isThreadsafe==0
           || sqlite3GlobalConfig.bFullMutex==0 );
    sqlite3_mutex_leave(db->mutex);
  }
  rc = sqlite3_errcode(db);
  assert( db!=0 || (rc&0xff)==SQLITE_NOMEM );
  if( (rc&0xff)==SQLITE_NOMEM ){
    sqlite3_close(db);
    db = 0;
  }else if( rc!=SQLITE_OK ){
    db->eOpenState = SQLITE_STATE_SICK;
  }
  *ppDb = db;
#ifdef SQLITE_ENABLE_SQLLOG
  if( sqlite3GlobalConfig.xSqllog ){
    /* Opening a db handle. Fourth parameter is passed 0. */
    void *pArg = sqlite3GlobalConfig.pSqllogArg;
    sqlite3GlobalConfig.xSqllog(pArg, db, zFilename, 0);
  }
#endif
  sqlite3_free_filename(zOpen);
  return rc;
}